

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_pkt.cc
# Opt level: O1

int bssl::tls_write_app_data
              (SSL *ssl,bool *out_needs_handshake,size_t *out_bytes_written,
              Span<const_unsigned_char> in)

{
  uint16_t *puVar1;
  ushort uVar2;
  uint uVar3;
  SSL3_STATE *pSVar4;
  SSL_HANDSHAKE *pSVar5;
  bool bVar6;
  int iVar7;
  SSL_PROTOCOL_METHOD *pSVar8;
  SSL_PROTOCOL_METHOD *pSVar9;
  uint uVar10;
  int line;
  size_t in_R9;
  bool *pbVar11;
  uchar *puVar12;
  byte bVar13;
  Span<const_unsigned_char> in_00;
  size_t bytes_written;
  int local_4c;
  SSL_PROTOCOL_METHOD *local_38;
  
  bVar6 = ssl_can_write(ssl);
  if (!bVar6) {
    __assert_fail("ssl_can_write(ssl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                  ,0x28,"int bssl::tls_write_app_data(SSL *, bool *, size_t *, Span<const uint8_t>)"
                 );
  }
  pSVar4 = ssl->s3;
  if (((pSVar4->aead_write_ctx)._M_t.
       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
      (SSL_CIPHER *)0x0) {
    __assert_fail("!ssl->s3->aead_write_ctx->is_null_cipher()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                  ,0x29,"int bssl::tls_write_app_data(SSL *, bool *, size_t *, Span<const uint8_t>)"
                 );
  }
  *out_needs_handshake = false;
  if (pSVar4->write_shutdown == ssl_shutdown_none) {
    pbVar11 = (bool *)pSVar4->unreported_bytes_written;
    pSVar8 = (SSL_PROTOCOL_METHOD *)((uchar *)in.size_ + -(long)pbVar11);
    if (pbVar11 <= (uchar *)in.size_) {
      if (((ssl->field_0xa4 & 1) == 0) && (iVar7 = SSL_in_early_data(ssl), iVar7 != 0)) {
        bVar13 = (((ssl->s3->hs)._M_t.
                   super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl)->field_0x6c9 &
                 0x20) >> 5;
      }
      else {
        bVar13 = 0;
      }
      puVar12 = in.data_ + (long)pbVar11;
      do {
        pSVar9 = (SSL_PROTOCOL_METHOD *)(ulong)ssl->max_send_fragment;
        if (bVar13 == 0) {
LAB_0014b3e5:
          if (pSVar8 < pSVar9) {
            pSVar9 = pSVar8;
          }
          in_00.size_ = in_R9;
          in_00.data_ = &pSVar9->is_dtls;
          iVar7 = do_tls_write((bssl *)ssl,(SSL *)&stack0xffffffffffffffc8,(size_t *)0x17,
                               (uint8_t)puVar12,in_00);
          if (iVar7 < 1) {
            ssl->s3->unreported_bytes_written = (size_t)pbVar11;
            bVar6 = false;
            local_4c = iVar7;
          }
          else {
            if (pSVar9 < local_38) {
              __assert_fail("bytes_written <= to_write",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                            ,0x5c,
                            "int bssl::tls_write_app_data(SSL *, bool *, size_t *, Span<const uint8_t>)"
                           );
            }
            bVar6 = pSVar8 < local_38;
            pSVar8 = (SSL_PROTOCOL_METHOD *)((long)pSVar8 - (long)local_38);
            if (bVar6) {
              abort();
            }
            if (bVar13 != 0) {
              puVar1 = &((ssl->s3->hs)._M_t.
                         super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl)->
                        early_data_written;
              *puVar1 = *puVar1 + (short)local_38;
            }
            pbVar11 = &local_38->is_dtls + (long)pbVar11;
            puVar12 = puVar12 + (long)local_38;
            if ((pSVar8 == (SSL_PROTOCOL_METHOD *)0x0) || (bVar6 = true, (ssl->mode & 1) != 0)) {
              ssl->s3->unreported_bytes_written = 0;
              *out_bytes_written = (size_t)pbVar11;
              local_4c = 1;
              goto LAB_0014b468;
            }
          }
        }
        else {
          pSVar5 = (ssl->s3->hs)._M_t.
                   super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
          uVar2 = pSVar5->early_data_written;
          uVar3 = *(uint *)((long)(pSVar5->early_session)._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> +
                           0x184);
          uVar10 = uVar3 - uVar2;
          if (uVar3 < uVar2 || uVar10 == 0) {
            ssl->s3->unreported_bytes_written = (size_t)pbVar11;
            pSVar5->field_0x6c9 = pSVar5->field_0x6c9 & 0xdf;
            *out_needs_handshake = true;
            local_4c = -1;
          }
          else if ((SSL_PROTOCOL_METHOD *)(ulong)uVar10 < pSVar9) {
            pSVar9 = (SSL_PROTOCOL_METHOD *)(ulong)uVar10;
          }
          if (uVar2 < uVar3) goto LAB_0014b3e5;
LAB_0014b468:
          bVar6 = false;
        }
        if (!bVar6) {
          return local_4c;
        }
      } while( true );
    }
    iVar7 = 0x6f;
    line = 0x3a;
  }
  else {
    iVar7 = 0xc2;
    line = 0x2e;
  }
  ERR_put_error(0x10,0,iVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                ,line);
  return -1;
}

Assistant:

int tls_write_app_data(SSL *ssl, bool *out_needs_handshake,
                       size_t *out_bytes_written, Span<const uint8_t> in) {
  assert(ssl_can_write(ssl));
  assert(!ssl->s3->aead_write_ctx->is_null_cipher());

  *out_needs_handshake = false;

  if (ssl->s3->write_shutdown != ssl_shutdown_none) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PROTOCOL_IS_SHUTDOWN);
    return -1;
  }

  size_t total_bytes_written = ssl->s3->unreported_bytes_written;
  if (in.size() < total_bytes_written) {
    // This can happen if the caller disables |SSL_MODE_ENABLE_PARTIAL_WRITE|,
    // asks us to write some input of length N, we successfully encrypt M bytes
    // and write it, but fail to write the rest. We will report
    // |SSL_ERROR_WANT_WRITE|. If the caller then retries with fewer than M
    // bytes, we cannot satisfy that request. The caller is required to always
    // retry with at least as many bytes as the previous attempt.
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_LENGTH);
    return -1;
  }

  in = in.subspan(total_bytes_written);

  const bool is_early_data_write =
      !ssl->server && SSL_in_early_data(ssl) && ssl->s3->hs->can_early_write;
  for (;;) {
    size_t max_send_fragment = ssl->max_send_fragment;
    if (is_early_data_write) {
      SSL_HANDSHAKE *hs = ssl->s3->hs.get();
      if (hs->early_data_written >= hs->early_session->ticket_max_early_data) {
        ssl->s3->unreported_bytes_written = total_bytes_written;
        hs->can_early_write = false;
        *out_needs_handshake = true;
        return -1;
      }
      max_send_fragment = std::min(
          max_send_fragment, size_t{hs->early_session->ticket_max_early_data -
                                    hs->early_data_written});
    }

    const size_t to_write = std::min(max_send_fragment, in.size());
    size_t bytes_written;
    int ret = do_tls_write(ssl, &bytes_written, SSL3_RT_APPLICATION_DATA,
                           in.subspan(0, to_write));
    if (ret <= 0) {
      ssl->s3->unreported_bytes_written = total_bytes_written;
      return ret;
    }

    // Note |bytes_written| may be less than |to_write| if there was a pending
    // record from a smaller write attempt.
    assert(bytes_written <= to_write);
    total_bytes_written += bytes_written;
    in = in.subspan(bytes_written);
    if (is_early_data_write) {
      ssl->s3->hs->early_data_written += bytes_written;
    }

    if (in.empty() || (ssl->mode & SSL_MODE_ENABLE_PARTIAL_WRITE)) {
      ssl->s3->unreported_bytes_written = 0;
      *out_bytes_written = total_bytes_written;
      return 1;
    }
  }
}